

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O3

Pass * wasm::createMemory64LoweringPass(void)

{
  Pass *__s;
  
  __s = (Pass *)operator_new(0x130);
  memset(__s,0,0x110);
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->name).field_2._M_local_buf[0] = '\0';
  __s[1]._vptr_Pass = (_func_int **)0x0;
  __s[1].runner = (PassRunner *)0x0;
  __s[3]._vptr_Pass = (_func_int **)0x0;
  __s[3].runner = (PassRunner *)0x0;
  __s[3].name._M_dataplus._M_p = (pointer)0x0;
  __s[3].name._M_string_length = 0;
  __s[3].name.field_2._M_allocated_capacity = 0;
  __s->_vptr_Pass = (_func_int **)&PTR__WalkerPass_01073980;
  return __s;
}

Assistant:

Pass* createMemory64LoweringPass() { return new Memory64Lowering(); }